

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O2

void Imf_2_5::anon_unknown_13::calculateNumTiles
               (int *numTiles,int numLevels,int min,int max,int size,LevelRoundingMode rmode)

{
  int iVar1;
  ArgExc *this;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)numLevels;
  if (numLevels < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      return;
    }
    iVar1 = levelSize(min,max,(int)uVar2,rmode);
    if (-0x80000000 - size < iVar1) break;
    numTiles[uVar2] = (iVar1 + size + -1) / size;
    uVar2 = uVar2 + 1;
  }
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,"Invalid size.");
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
calculateNumTiles (int *numTiles,
		   int numLevels,
		   int min, int max,
		   int size,
		   LevelRoundingMode rmode)
{
    for (int i = 0; i < numLevels; i++)
    {
        int l = levelSize (min, max, i, rmode);
        if (l > std::numeric_limits<int>::max() - size + 1)
            throw IEX_NAMESPACE::ArgExc ("Invalid size.");

        numTiles[i] = (l + size - 1) / size;
    }
}